

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void SharpYUVFilterRow_SSE2(int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint16_t uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined8 *puVar15;
  long lVar16;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  short sVar17;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  int v1;
  int v0;
  int a0a1b0b1_1;
  int a1b0_1;
  int a0b1_1;
  __m128i i1;
  __m128i i0;
  __m128i h1;
  __m128i h0;
  __m128i g1;
  __m128i g0;
  __m128i f1;
  __m128i f0;
  __m128i e1;
  __m128i e0;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i a1b0_2;
  __m128i a0b1_2;
  __m128i a0a1b0b1_8;
  __m128i a0a1b0b1;
  __m128i a1b0;
  __m128i a0b1;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i zero;
  __m128i max;
  __m128i kCst8;
  int i;
  int local_3bc;
  short local_328;
  short sStack_326;
  short sStack_324;
  short sStack_322;
  short sStack_320;
  short sStack_31e;
  short sStack_31c;
  short sStack_31a;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short sStack_2c0;
  short sStack_2be;
  short sStack_2bc;
  short sStack_2ba;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  
  for (local_3bc = 0; local_3bc + 8 <= in_EDX; local_3bc = local_3bc + 8) {
    puVar15 = (undefined8 *)(in_RDI + (long)local_3bc * 2);
    uVar1 = *puVar15;
    uVar2 = puVar15[1];
    puVar15 = (undefined8 *)(in_RDI + 2 + (long)local_3bc * 2);
    uVar3 = *puVar15;
    uVar4 = puVar15[1];
    puVar15 = (undefined8 *)(in_RSI + (long)local_3bc * 2);
    uVar5 = *puVar15;
    uVar6 = puVar15[1];
    puVar15 = (undefined8 *)(in_RSI + 2 + (long)local_3bc * 2);
    uVar7 = *puVar15;
    uVar8 = puVar15[1];
    local_1c8 = (short)uVar1;
    sStack_1c6 = (short)((ulong)uVar1 >> 0x10);
    sStack_1c4 = (short)((ulong)uVar1 >> 0x20);
    sStack_1c2 = (short)((ulong)uVar1 >> 0x30);
    sStack_1c0 = (short)uVar2;
    sStack_1be = (short)((ulong)uVar2 >> 0x10);
    sStack_1bc = (short)((ulong)uVar2 >> 0x20);
    sStack_1ba = (short)((ulong)uVar2 >> 0x30);
    local_1d8 = (short)uVar7;
    sStack_1d6 = (short)((ulong)uVar7 >> 0x10);
    sStack_1d4 = (short)((ulong)uVar7 >> 0x20);
    sStack_1d2 = (short)((ulong)uVar7 >> 0x30);
    sStack_1d0 = (short)uVar8;
    sStack_1ce = (short)((ulong)uVar8 >> 0x10);
    sStack_1cc = (short)((ulong)uVar8 >> 0x20);
    sStack_1ca = (short)((ulong)uVar8 >> 0x30);
    local_1e8 = (short)uVar3;
    sStack_1e6 = (short)((ulong)uVar3 >> 0x10);
    sStack_1e4 = (short)((ulong)uVar3 >> 0x20);
    sStack_1e2 = (short)((ulong)uVar3 >> 0x30);
    sStack_1e0 = (short)uVar4;
    sStack_1de = (short)((ulong)uVar4 >> 0x10);
    sStack_1dc = (short)((ulong)uVar4 >> 0x20);
    sStack_1da = (short)((ulong)uVar4 >> 0x30);
    local_1f8 = (short)uVar5;
    sStack_1f6 = (short)((ulong)uVar5 >> 0x10);
    sStack_1f4 = (short)((ulong)uVar5 >> 0x20);
    sStack_1f2 = (short)((ulong)uVar5 >> 0x30);
    sStack_1f0 = (short)uVar6;
    sStack_1ee = (short)((ulong)uVar6 >> 0x10);
    sStack_1ec = (short)((ulong)uVar6 >> 0x20);
    sStack_1ea = (short)((ulong)uVar6 >> 0x30);
    sVar17 = local_1c8 + local_1d8 + local_1e8 + local_1f8 + 8;
    sVar20 = sStack_1c6 + sStack_1d6 + sStack_1e6 + sStack_1f6 + 8;
    sVar21 = sStack_1c4 + sStack_1d4 + sStack_1e4 + sStack_1f4 + 8;
    sVar22 = sStack_1c2 + sStack_1d2 + sStack_1e2 + sStack_1f2 + 8;
    sVar23 = sStack_1c0 + sStack_1d0 + sStack_1e0 + sStack_1f0 + 8;
    sVar24 = sStack_1be + sStack_1ce + sStack_1de + sStack_1ee + 8;
    sVar25 = sStack_1bc + sStack_1cc + sStack_1dc + sStack_1ec + 8;
    sVar26 = sStack_1ba + sStack_1ca + sStack_1da + sStack_1ea + 8;
    auVar10._2_2_ = (sStack_1c6 + sStack_1d6) * 2 + sVar20;
    auVar10._0_2_ = (local_1c8 + local_1d8) * 2 + sVar17;
    auVar10._4_2_ = (sStack_1c4 + sStack_1d4) * 2 + sVar21;
    auVar10._6_2_ = (sStack_1c2 + sStack_1d2) * 2 + sVar22;
    auVar10._8_2_ = (sStack_1c0 + sStack_1d0) * 2 + sVar23;
    auVar10._10_2_ = (sStack_1be + sStack_1ce) * 2 + sVar24;
    auVar10._12_2_ = (sStack_1bc + sStack_1cc) * 2 + sVar25;
    auVar10._14_2_ = (sStack_1ba + sStack_1ca) * 2 + sVar26;
    auVar18 = psraw(auVar10,ZEXT416(3));
    auVar9._2_2_ = (sStack_1e6 + sStack_1f6) * 2 + sVar20;
    auVar9._0_2_ = (local_1e8 + local_1f8) * 2 + sVar17;
    auVar9._4_2_ = (sStack_1e4 + sStack_1f4) * 2 + sVar21;
    auVar9._6_2_ = (sStack_1e2 + sStack_1f2) * 2 + sVar22;
    auVar9._8_2_ = (sStack_1e0 + sStack_1f0) * 2 + sVar23;
    auVar9._10_2_ = (sStack_1de + sStack_1ee) * 2 + sVar24;
    auVar9._12_2_ = (sStack_1dc + sStack_1ec) * 2 + sVar25;
    auVar9._14_2_ = (sStack_1da + sStack_1ea) * 2 + sVar26;
    auVar19 = psraw(auVar9,ZEXT416(3));
    local_2c8 = auVar19._0_2_;
    sStack_2c6 = auVar19._2_2_;
    sStack_2c4 = auVar19._4_2_;
    sStack_2c2 = auVar19._6_2_;
    sStack_2c0 = auVar19._8_2_;
    sStack_2be = auVar19._10_2_;
    sStack_2bc = auVar19._12_2_;
    sStack_2ba = auVar19._14_2_;
    local_2e8 = auVar18._0_2_;
    sStack_2e6 = auVar18._2_2_;
    sStack_2e4 = auVar18._4_2_;
    sStack_2e2 = auVar18._6_2_;
    sStack_2e0 = auVar18._8_2_;
    sStack_2de = auVar18._10_2_;
    sStack_2dc = auVar18._12_2_;
    sStack_2da = auVar18._14_2_;
    auVar19._2_2_ = sStack_2c6 + sStack_1c6;
    auVar19._0_2_ = local_2c8 + local_1c8;
    auVar19._4_2_ = sStack_2c4 + sStack_1c4;
    auVar19._6_2_ = sStack_2c2 + sStack_1c2;
    auVar19._10_2_ = sStack_2be + sStack_1be;
    auVar19._8_2_ = sStack_2c0 + sStack_1c0;
    auVar19._12_2_ = sStack_2bc + sStack_1bc;
    auVar19._14_2_ = sStack_2ba + sStack_1ba;
    auVar19 = psraw(auVar19,ZEXT416(1));
    auVar18._2_2_ = sStack_2e6 + sStack_1e6;
    auVar18._0_2_ = local_2e8 + local_1e8;
    auVar18._4_2_ = sStack_2e4 + sStack_1e4;
    auVar18._6_2_ = sStack_2e2 + sStack_1e2;
    auVar18._10_2_ = sStack_2de + sStack_1de;
    auVar18._8_2_ = sStack_2e0 + sStack_1e0;
    auVar18._12_2_ = sStack_2dc + sStack_1dc;
    auVar18._14_2_ = sStack_2da + sStack_1da;
    auVar18 = psraw(auVar18,ZEXT416(1));
    local_128 = auVar19._0_2_;
    sStack_126 = auVar19._2_2_;
    sStack_124 = auVar19._4_2_;
    sStack_122 = auVar19._6_2_;
    local_138 = auVar18._0_2_;
    sStack_136 = auVar18._2_2_;
    sStack_134 = auVar18._4_2_;
    sStack_132 = auVar18._6_2_;
    sStack_100 = auVar19._8_2_;
    sStack_fe = auVar19._10_2_;
    sStack_fc = auVar19._12_2_;
    sStack_fa = auVar19._14_2_;
    sStack_110 = auVar18._8_2_;
    sStack_10e = auVar18._10_2_;
    sStack_10c = auVar18._12_2_;
    sStack_10a = auVar18._14_2_;
    puVar15 = (undefined8 *)(in_RCX + (long)(local_3bc << 1) * 2);
    uVar1 = *puVar15;
    uVar2 = puVar15[1];
    lVar16 = in_RCX + (long)(local_3bc << 1) * 2;
    uVar3 = *(undefined8 *)(lVar16 + 0x10);
    uVar4 = *(undefined8 *)(lVar16 + 0x18);
    local_308 = (short)uVar1;
    sStack_306 = (short)((ulong)uVar1 >> 0x10);
    sStack_304 = (short)((ulong)uVar1 >> 0x20);
    sStack_302 = (short)((ulong)uVar1 >> 0x30);
    sStack_300 = (short)uVar2;
    sStack_2fe = (short)((ulong)uVar2 >> 0x10);
    sStack_2fc = (short)((ulong)uVar2 >> 0x20);
    sStack_2fa = (short)((ulong)uVar2 >> 0x30);
    local_308 = local_308 + local_128;
    sStack_306 = sStack_306 + local_138;
    sStack_304 = sStack_304 + sStack_126;
    sStack_302 = sStack_302 + sStack_136;
    sStack_300 = sStack_300 + sStack_124;
    sStack_2fe = sStack_2fe + sStack_134;
    sStack_2fc = sStack_2fc + sStack_122;
    sStack_2fa = sStack_2fa + sStack_132;
    local_328 = (short)uVar3;
    sStack_326 = (short)((ulong)uVar3 >> 0x10);
    sStack_324 = (short)((ulong)uVar3 >> 0x20);
    sStack_322 = (short)((ulong)uVar3 >> 0x30);
    sStack_320 = (short)uVar4;
    sStack_31e = (short)((ulong)uVar4 >> 0x10);
    sStack_31c = (short)((ulong)uVar4 >> 0x20);
    sStack_31a = (short)((ulong)uVar4 >> 0x30);
    local_328 = local_328 + sStack_100;
    sStack_326 = sStack_326 + sStack_110;
    sStack_324 = sStack_324 + sStack_fe;
    sStack_322 = sStack_322 + sStack_10e;
    sStack_320 = sStack_320 + sStack_fc;
    sStack_31e = sStack_31e + sStack_10c;
    sStack_31c = sStack_31c + sStack_fa;
    sStack_31a = sStack_31a + sStack_10a;
    uVar27 = (ushort)(0x3ff < local_308) * 0x3ff | (ushort)(0x3ff >= local_308) * local_308;
    uVar29 = (ushort)(0x3ff < sStack_306) * 0x3ff | (ushort)(0x3ff >= sStack_306) * sStack_306;
    uVar31 = (ushort)(0x3ff < sStack_304) * 0x3ff | (ushort)(0x3ff >= sStack_304) * sStack_304;
    uVar33 = (ushort)(0x3ff < sStack_302) * 0x3ff | (ushort)(0x3ff >= sStack_302) * sStack_302;
    uVar35 = (ushort)(0x3ff < sStack_300) * 0x3ff | (ushort)(0x3ff >= sStack_300) * sStack_300;
    uVar37 = (ushort)(0x3ff < sStack_2fe) * 0x3ff | (ushort)(0x3ff >= sStack_2fe) * sStack_2fe;
    uVar39 = (ushort)(0x3ff < sStack_2fc) * 0x3ff | (ushort)(0x3ff >= sStack_2fc) * sStack_2fc;
    uVar41 = (ushort)(0x3ff < sStack_2fa) * 0x3ff | (ushort)(0x3ff >= sStack_2fa) * sStack_2fa;
    uVar28 = (ushort)(0x3ff < local_328) * 0x3ff | (ushort)(0x3ff >= local_328) * local_328;
    uVar30 = (ushort)(0x3ff < sStack_326) * 0x3ff | (ushort)(0x3ff >= sStack_326) * sStack_326;
    uVar32 = (ushort)(0x3ff < sStack_324) * 0x3ff | (ushort)(0x3ff >= sStack_324) * sStack_324;
    uVar34 = (ushort)(0x3ff < sStack_322) * 0x3ff | (ushort)(0x3ff >= sStack_322) * sStack_322;
    uVar36 = (ushort)(0x3ff < sStack_320) * 0x3ff | (ushort)(0x3ff >= sStack_320) * sStack_320;
    uVar38 = (ushort)(0x3ff < sStack_31e) * 0x3ff | (ushort)(0x3ff >= sStack_31e) * sStack_31e;
    uVar40 = (ushort)(0x3ff < sStack_31c) * 0x3ff | (ushort)(0x3ff >= sStack_31c) * sStack_31c;
    uVar42 = (ushort)(0x3ff < sStack_31a) * 0x3ff | (ushort)(0x3ff >= sStack_31a) * sStack_31a;
    puVar15 = (undefined8 *)(in_R8 + (long)(local_3bc << 1) * 2);
    *puVar15 = CONCAT26((-1 < (short)uVar33) * uVar33,
                        CONCAT24((-1 < (short)uVar31) * uVar31,
                                 CONCAT22((-1 < (short)uVar29) * uVar29,
                                          (-1 < (short)uVar27) * uVar27)));
    puVar15[1] = CONCAT26((-1 < (short)uVar41) * uVar41,
                          CONCAT24((-1 < (short)uVar39) * uVar39,
                                   CONCAT22((-1 < (short)uVar37) * uVar37,
                                            (-1 < (short)uVar35) * uVar35)));
    lVar16 = in_R8 + (long)(local_3bc << 1) * 2;
    *(ulong *)(lVar16 + 0x10) =
         CONCAT26((-1 < (short)uVar34) * uVar34,
                  CONCAT24((-1 < (short)uVar32) * uVar32,
                           CONCAT22((-1 < (short)uVar30) * uVar30,(-1 < (short)uVar28) * uVar28)));
    *(ulong *)(lVar16 + 0x18) =
         CONCAT26((-1 < (short)uVar42) * uVar42,
                  CONCAT24((-1 < (short)uVar40) * uVar40,
                           CONCAT22((-1 < (short)uVar38) * uVar38,(-1 < (short)uVar36) * uVar36)));
  }
  for (; local_3bc < in_EDX; local_3bc = local_3bc + 1) {
    iVar12 = (int)*(short *)(in_RDI + (long)local_3bc * 2) +
             (int)*(short *)(in_RSI + (long)(local_3bc + 1) * 2);
    iVar13 = (int)*(short *)(in_RDI + (long)(local_3bc + 1) * 2) +
             (int)*(short *)(in_RSI + (long)local_3bc * 2);
    iVar14 = iVar12 + iVar13 + 8;
    sVar17 = *(short *)(in_RDI + (long)(local_3bc + 1) * 2);
    uVar11 = clip_y((uint)*(ushort *)(in_RCX + (long)(local_3bc << 1) * 2) +
                    (*(short *)(in_RDI + (long)local_3bc * 2) * 8 + iVar13 * 2 + iVar14 >> 4));
    *(uint16_t *)(in_R8 + (long)(local_3bc << 1) * 2) = uVar11;
    uVar11 = clip_y((uint)*(ushort *)(in_RCX + (long)(local_3bc * 2 + 1) * 2) +
                    (sVar17 * 8 + iVar12 * 2 + iVar14 >> 4));
    *(uint16_t *)(in_R8 + (long)(local_3bc * 2 + 1) * 2) = uVar11;
  }
  return;
}

Assistant:

static void SharpYUVFilterRow_SSE2(const int16_t* A, const int16_t* B, int len,
                                   const uint16_t* best_y, uint16_t* out) {
  int i;
  const __m128i kCst8 = _mm_set1_epi16(8);
  const __m128i max = _mm_set1_epi16(MAX_Y);
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)(A + i + 0));
    const __m128i a1 = _mm_loadu_si128((const __m128i*)(A + i + 1));
    const __m128i b0 = _mm_loadu_si128((const __m128i*)(B + i + 0));
    const __m128i b1 = _mm_loadu_si128((const __m128i*)(B + i + 1));
    const __m128i a0b1 = _mm_add_epi16(a0, b1);
    const __m128i a1b0 = _mm_add_epi16(a1, b0);
    const __m128i a0a1b0b1 = _mm_add_epi16(a0b1, a1b0);  // A0+A1+B0+B1
    const __m128i a0a1b0b1_8 = _mm_add_epi16(a0a1b0b1, kCst8);
    const __m128i a0b1_2 = _mm_add_epi16(a0b1, a0b1);    // 2*(A0+B1)
    const __m128i a1b0_2 = _mm_add_epi16(a1b0, a1b0);    // 2*(A1+B0)
    const __m128i c0 = _mm_srai_epi16(_mm_add_epi16(a0b1_2, a0a1b0b1_8), 3);
    const __m128i c1 = _mm_srai_epi16(_mm_add_epi16(a1b0_2, a0a1b0b1_8), 3);
    const __m128i d0 = _mm_add_epi16(c1, a0);
    const __m128i d1 = _mm_add_epi16(c0, a1);
    const __m128i e0 = _mm_srai_epi16(d0, 1);
    const __m128i e1 = _mm_srai_epi16(d1, 1);
    const __m128i f0 = _mm_unpacklo_epi16(e0, e1);
    const __m128i f1 = _mm_unpackhi_epi16(e0, e1);
    const __m128i g0 = _mm_loadu_si128((const __m128i*)(best_y + 2 * i + 0));
    const __m128i g1 = _mm_loadu_si128((const __m128i*)(best_y + 2 * i + 8));
    const __m128i h0 = _mm_add_epi16(g0, f0);
    const __m128i h1 = _mm_add_epi16(g1, f1);
    const __m128i i0 = _mm_max_epi16(_mm_min_epi16(h0, max), zero);
    const __m128i i1 = _mm_max_epi16(_mm_min_epi16(h1, max), zero);
    _mm_storeu_si128((__m128i*)(out + 2 * i + 0), i0);
    _mm_storeu_si128((__m128i*)(out + 2 * i + 8), i1);
  }
  for (; i < len; ++i) {
    //   (9 * A0 + 3 * A1 + 3 * B0 + B1 + 8) >> 4 =
    // = (8 * A0 + 2 * (A1 + B0) + (A0 + A1 + B0 + B1 + 8)) >> 4
    // We reuse the common sub-expressions.
    const int a0b1 = A[i + 0] + B[i + 1];
    const int a1b0 = A[i + 1] + B[i + 0];
    const int a0a1b0b1 = a0b1 + a1b0 + 8;
    const int v0 = (8 * A[i + 0] + 2 * a1b0 + a0a1b0b1) >> 4;
    const int v1 = (8 * A[i + 1] + 2 * a0b1 + a0a1b0b1) >> 4;
    out[2 * i + 0] = clip_y(best_y[2 * i + 0] + v0);
    out[2 * i + 1] = clip_y(best_y[2 * i + 1] + v1);
  }
}